

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

void Dch_ClassesPrintOne(Dch_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  int level;
  long lVar7;
  Aig_Man_t *p_00;
  
  p_00 = (Aig_Man_t *)p;
  Abc_Print((int)p,"{ ");
  level = (int)p_00;
  piVar4 = p->pClassSizes;
  iVar5 = pRepr->Id;
  lVar6 = (long)iVar5;
  if (0 < piVar4[lVar6]) {
    lVar7 = 0;
    do {
      pObj = p->pId2Class[lVar6][lVar7];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar1 = pObj->Id;
        uVar2 = *(uint *)&pObj->field_0x1c;
        p_00 = p->pAig;
        uVar3 = Aig_SupportSize(p_00,pObj);
        Abc_Print((int)p_00,"%d(%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3);
        piVar4 = p->pClassSizes;
        iVar5 = pRepr->Id;
      }
      level = (int)p_00;
      lVar7 = lVar7 + 1;
      lVar6 = (long)iVar5;
    } while (lVar7 < piVar4[lVar6]);
  }
  Abc_Print(level,"}\n");
  return;
}

Assistant:

void Dch_ClassesPrintOne( Dch_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Dch_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d) ", pObj->Id, pObj->Level, Aig_SupportSize(p->pAig,pObj) );
    Abc_Print( 1, "}\n" );
}